

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int take_off(void)

{
  obj *otmp_00;
  obj *local_18;
  obj *otmp;
  int i;
  
  if (taking_off != 0) {
    if (0 < todelay) {
      todelay = todelay + -1;
      return 1;
    }
    otmp_00 = do_takeoff();
    if (otmp_00 != (obj *)0x0) {
      off_msg(otmp_00,'\x01');
    }
    takeoff_mask = (taking_off ^ 0xffffffffffffffffU) & takeoff_mask;
    taking_off = 0;
  }
  otmp._0_4_ = 0;
  do {
    if (takeoff_order[(int)otmp] == 0) {
LAB_001bacf3:
      local_18 = (obj *)0x0;
      todelay = 0;
      if (taking_off == 0) {
        pline("You finish %s.",disrobing);
        otmp._4_4_ = 0;
      }
      else {
        if (taking_off == 0x100) {
          todelay = 1;
        }
        else if (taking_off == 0x400) {
          todelay = 1;
        }
        else if (taking_off == 0x200) {
          todelay = 1;
        }
        else if (taking_off == 1) {
          local_18 = uarm;
          if (uarmc != (obj *)0x0) {
            todelay = objects[uarmc->otyp].oc_delay * 2 + 1;
          }
        }
        else if (taking_off == 2) {
          local_18 = uarmc;
        }
        else if (taking_off == 0x20) {
          local_18 = uarmf;
        }
        else if (taking_off == 0x10) {
          local_18 = uarmg;
        }
        else if (taking_off == 4) {
          local_18 = uarmh;
        }
        else if (taking_off == 8) {
          local_18 = uarms;
        }
        else if (taking_off == 0x40) {
          local_18 = uarmu;
          if (uarm != (obj *)0x0) {
            todelay = objects[uarm->otyp].oc_delay * 2;
          }
          if (uarmc != (obj *)0x0) {
            todelay = objects[uarmc->otyp].oc_delay * 2 + 1 + todelay;
          }
        }
        else if (taking_off == 0x10000) {
          todelay = 1;
        }
        else if (taking_off == 0x20000) {
          todelay = 1;
        }
        else if (taking_off == 0x40000) {
          todelay = 1;
        }
        else {
          if (taking_off != 0x80000) {
            warning("take_off: taking off %lx",taking_off);
            return 0;
          }
          todelay = 2;
        }
        if (local_18 != (obj *)0x0) {
          todelay = objects[local_18->otyp].oc_delay + todelay;
        }
        if (0 < todelay) {
          todelay = todelay + -1;
        }
        set_occupation(take_off,disrobing,0);
        otmp._4_4_ = 1;
      }
      return otmp._4_4_;
    }
    if ((takeoff_mask & takeoff_order[(int)otmp]) != 0) {
      taking_off = takeoff_order[(int)otmp];
      goto LAB_001bacf3;
    }
    otmp._0_4_ = (int)otmp + 1;
  } while( true );
}

Assistant:

static int take_off(void)
{
	int i;
	struct obj *otmp;

	if (taking_off) {
	    if (todelay > 0) {
		todelay--;
		return 1;	/* still busy */
	    } else {
		if ((otmp = do_takeoff())) off_msg(otmp, TRUE);
	    }
	    takeoff_mask &= ~taking_off;
	    taking_off = 0L;
	}

	for (i = 0; takeoff_order[i]; i++)
	    if (takeoff_mask & takeoff_order[i]) {
		taking_off = takeoff_order[i];
		break;
	    }

	otmp = NULL;
	todelay = 0;

	if (taking_off == 0L) {
	  pline("You finish %s.", disrobing);
	  return 0;
	} else if (taking_off == W_WEP) {
	  todelay = 1;
	} else if (taking_off == W_SWAPWEP) {
	  todelay = 1;
	} else if (taking_off == W_QUIVER) {
	  todelay = 1;
	} else if (taking_off == WORN_ARMOR) {
	  otmp = uarm;
	  /* If a cloak is being worn, add the time to take it off and put
	   * it back on again.  Kludge alert! since that time is 0 for all
	   * known cloaks, add 1 so that it actually matters...
	   */
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_CLOAK) {
	  otmp = uarmc;
	} else if (taking_off == WORN_BOOTS) {
	  otmp = uarmf;
	} else if (taking_off == WORN_GLOVES) {
	  otmp = uarmg;
	} else if (taking_off == WORN_HELMET) {
	  otmp = uarmh;
	} else if (taking_off == WORN_SHIELD) {
	  otmp = uarms;
	} else if (taking_off == WORN_SHIRT) {
	  otmp = uarmu;
	  /* add the time to take off and put back on armor and/or cloak */
	  if (uarm)  todelay += 2 * objects[uarm->otyp].oc_delay;
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_AMUL) {
	  todelay = 1;
	} else if (taking_off == LEFT_RING) {
	  todelay = 1;
	} else if (taking_off == RIGHT_RING) {
	  todelay = 1;
	} else if (taking_off == WORN_BLINDF) {
	  todelay = 2;
	} else {
	  warning("take_off: taking off %lx", taking_off);
	  return 0;	/* force done */
	}

	if (otmp) todelay += objects[otmp->otyp].oc_delay;

	/* Since setting the occupation now starts the counter next move, that
	 * would always produce a delay 1 too big per item unless we subtract
	 * 1 here to account for it.
	 */
	if (todelay > 0) todelay--;

	set_occupation(take_off, disrobing, 0);
	return 1;		/* get busy */
}